

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_threadpool.cpp
# Opt level: O2

string_view __thiscall
cls_static_func::cls_static_tn_callbackstr(cls_static_func *this,int n,string_view str)

{
  longlong lVar1;
  Logger *pLVar2;
  undefined4 in_register_00000034;
  string_view sVar3;
  id local_20;
  
  sVar3._M_len._4_4_ = in_register_00000034;
  sVar3._M_len._0_4_ = n;
  sVar3._M_str = (char *)str._M_len;
  local_20._M_thread = pthread_self();
  lVar1 = tid_to_ll(&local_20);
  pLVar2 = Logger::get_instance();
  if ((pLVar2->l_inited == false) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","cls_static_tn_callbackstr",
           0x3b);
  }
  if (1 < (int)g_log_level) {
    pLVar2 = Logger::get_instance();
    Logger::write_log(pLVar2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/threadpool/tests/test_threadpool.cpp"
                      ,"cls_static_tn_callbackstr",0x3b,LOG_LEVEL_INFO,
                      "[tid:%lld]  hello, cls_static_tn_callbackstr !\n",lVar1);
    pLVar2 = Logger::get_instance();
    Logger::flush(pLVar2);
  }
  return sVar3;
}

Assistant:

static string_view cls_static_tn_callbackstr(int n, string_view str) {
        long long tid = tid_to_ll(this_thread::get_id()); 
        LOG_INFO("[tid:%lld]  hello, cls_static_tn_callbackstr !\n", tid);
		return str;
	}